

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
* __thiscall
NJamSpell::TSpellCorrector::GetCandidatesWithScores
          (vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
           *__return_storage_ptr__,TSpellCorrector *this,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *sentence,size_t position)

{
  pointer *__args;
  wchar_t *pwVar1;
  undefined1 auVar2 [8];
  void *local_b8;
  TWords words;
  TWord local_90;
  undefined8 local_80;
  undefined1 local_78 [8];
  TScoredWords scoredCandidates;
  wstring word;
  
  std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::wstring_const*,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>,void>
            ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)&local_b8,
             (sentence->
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (sentence->
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (allocator_type *)
             &words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  GetCandidatesRawWithScores((TScoredWords *)local_78,this,(TWords *)&local_b8,position);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_78 !=
      (undefined1  [8])
      scoredCandidates.
      super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __args = &words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    auVar2 = local_78;
    do {
      pwVar1 = (((pointer)auVar2)->Word).Ptr;
      word.field_2._8_8_ = ((pointer)auVar2)->Score;
      scoredCandidates.
      super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&word._M_string_length;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)
                 &scoredCandidates.
                  super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pwVar1,
                 pwVar1 + (((pointer)auVar2)->Word).Len);
      words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &local_90;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)__args,
                 scoredCandidates.
                 super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (long)&((scoredCandidates.
                          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->Word).Ptr +
                 (long)word._M_dataplus._M_p * 4);
      local_80 = word.field_2._8_8_;
      std::
      vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
      ::emplace_back<std::pair<std::__cxx11::wstring,double>>
                ((vector<std::pair<std::__cxx11::wstring,double>,std::allocator<std::pair<std::__cxx11::wstring,double>>>
                  *)__return_storage_ptr__,
                 (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>
                  *)__args);
      if (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != &local_90) {
        operator_delete(words.
                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&word._M_string_length) {
        operator_delete(scoredCandidates.
                        super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      auVar2 = (undefined1  [8])((long)auVar2 + 0x18);
    } while (auVar2 != (undefined1  [8])
                       scoredCandidates.
                       super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78);
  }
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::wstring,double> > TSpellCorrector::GetCandidatesWithScores(
    const std::vector<std::wstring>& sentence,
    size_t position
) const {

    TWords words(sentence.begin(), sentence.end());
    TScoredWords scoredCandidates = GetCandidatesRawWithScores(words, position);

    std::vector<std::pair<std::wstring,double> > results;
    for (auto s: scoredCandidates) {
        std::wstring word = std::wstring(s.Word.Ptr, s.Word.Len);
        results.push_back(std::make_pair(word, s.Score));
    }
    return results;
}